

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::DumpBlockData(BackwardPass *this,BasicBlock *block,Instr *instr)

{
  bool bVar1;
  BVSparse<Memory::JitArenaAllocator> *local_f0;
  uint local_d8;
  uint local_d4;
  int i_1;
  int i;
  size_t maxTagLen;
  BvToDump bvToDumps [6];
  BVSparse<Memory::JitArenaAllocator> *local_30;
  BVSparse<Memory::JitArenaAllocator> *byteCodeRegisterUpwardExposed;
  int skip;
  Instr *instr_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  local_30 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  if (instr != (Instr *)0x0) {
    local_30 = GetByteCodeRegisterUpwardExposed(this,block,instr->m_func,this->tempAlloc);
  }
  BvToDump::BvToDump((BvToDump *)&maxTagLen,block->upwardExposedUses,L"Exposed Use");
  BvToDump::BvToDump((BvToDump *)&bvToDumps[0].tagLen,block->typesNeedingKnownObjectLayout,
                     L"Needs Known Object Layout");
  BvToDump::BvToDump((BvToDump *)&bvToDumps[1].tagLen,block->upwardExposedFields,L"Exposed Fields");
  BvToDump::BvToDump((BvToDump *)&bvToDumps[2].tagLen,block->byteCodeUpwardExposedUsed,
                     L"Byte Code Use");
  BvToDump::BvToDump((BvToDump *)&bvToDumps[3].tagLen,local_30,L"Byte Code Reg Use");
  bVar1 = IsCollectionPass(this);
  if (((bVar1) || ((*(ushort *)&block->field_0x18 >> 1 & 1) != 0)) ||
     (bVar1 = DoDeadStoreSlots(this), !bVar1)) {
    local_f0 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    local_f0 = block->slotDeadStoreCandidates;
  }
  BvToDump::BvToDump((BvToDump *)&bvToDumps[4].tagLen,local_f0,L"Slot deadStore candidates");
  _i_1 = (char16 *)0x0;
  for (local_d4 = 0; local_d4 < 6; local_d4 = local_d4 + 1) {
    if (_i_1 < bvToDumps[(int)local_d4].tag) {
      _i_1 = bvToDumps[(int)local_d4].tag;
    }
  }
  for (local_d8 = 0; local_d8 < 6; local_d8 = local_d8 + 1) {
    if (bvToDumps[(long)(int)local_d8 + -1].tagLen != 0) {
      Output::Print(((int)_i_1 + 8) - (int)bvToDumps[(int)local_d8].tag,L"%s: ",
                    bvToDumps[(int)local_d8].bv);
      BVSparse<Memory::JitArenaAllocator>::Dump
                ((BVSparse<Memory::JitArenaAllocator> *)bvToDumps[(long)(int)local_d8 + -1].tagLen);
    }
  }
  if (local_30 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,local_30);
  }
  return;
}

Assistant:

void
BackwardPass::DumpBlockData(BasicBlock * block, IR::Instr* instr)
{
    const int skip = 8;
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = nullptr;
    if (instr)
    {
        // Instr specific bv to dump
        byteCodeRegisterUpwardExposed = GetByteCodeRegisterUpwardExposed(block, instr->m_func, this->tempAlloc);
    }
    BvToDump bvToDumps[] = {
        { block->upwardExposedUses, _u("Exposed Use") },
        { block->typesNeedingKnownObjectLayout, _u("Needs Known Object Layout") },
        { block->upwardExposedFields, _u("Exposed Fields") },
        { block->byteCodeUpwardExposedUsed, _u("Byte Code Use") },
        { byteCodeRegisterUpwardExposed, _u("Byte Code Reg Use") },
        { !this->IsCollectionPass() && !block->isDead && this->DoDeadStoreSlots() ? block->slotDeadStoreCandidates : nullptr, _u("Slot deadStore candidates") },
    };

    size_t maxTagLen = 0;
    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].tagLen > maxTagLen)
        {
            maxTagLen = bvToDumps[i].tagLen;
        }
    }

    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].bv)
        {
            Output::Print((int)(maxTagLen + skip - bvToDumps[i].tagLen), _u("%s: "), bvToDumps[i].tag);
            bvToDumps[i].bv->Dump();
        }
    }
    if (byteCodeRegisterUpwardExposed)
    {
        JitAdelete(this->tempAlloc, byteCodeRegisterUpwardExposed);
    }
}